

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::checked::timed_mutex::
do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timed_mutex *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp,char *emsg)

{
  bool bVar1;
  cv_status cVar2;
  system_error *this_00;
  error_code eVar3;
  id local_90;
  id local_88;
  id local_80;
  id local_78;
  uint local_60;
  error_category *local_58;
  bool local_50;
  undefined7 uStack_4f;
  native_handle_type local_48;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lk;
  id tid;
  char *emsg_local;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *tp_local;
  mutex *this_local;
  
  lk._8_8_ = std::this_thread::get_id();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_40,(mutex_type *)(this + 0x38));
  local_48 = *(native_handle_type *)this;
  local_50 = lk._M_owns;
  uStack_4f = lk._9_7_;
  bVar1 = std::operator==((id)local_48,(id)lk._8_8_);
  if (bVar1) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    eVar3 = std::make_error_code(resource_deadlock_would_occur);
    local_60 = eVar3._M_value;
    eVar3._4_4_ = 0;
    eVar3._M_value = local_60;
    local_58 = eVar3._M_cat;
    std::system_error::system_error(this_00,eVar3,emsg);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  do {
    local_78._M_thread = *(native_handle_type *)this;
    std::thread::id::id(&local_80);
    bVar1 = std::operator!=(local_78,local_80);
    if (!bVar1) goto LAB_002cb7f8;
    cVar2 = std::condition_variable::
            wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 8),(unique_lock<std::mutex> *)local_40,tp);
  } while (cVar2 != timeout);
  local_88._M_thread = *(native_handle_type *)this;
  std::thread::id::id(&local_90);
  bVar1 = std::operator==(local_88,local_90);
  if (bVar1) {
LAB_002cb7f8:
    *(undefined8 *)this = lk._8_8_;
    validator::deadlock::locked((uintptr_t)this,(id)lk._8_8_,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp, const char* emsg)
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (owner_ == tid) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
      (void)emsg;  // suppress "unused variable" warning
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), emsg);
#endif
    }
    while (owner_ != std::thread::id()) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (owner_ == std::thread::id())  // re-check predicate
          break;
        return false;
      }
    }
    owner_ = tid;
    detail::validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }